

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_ManAssignInternWordNames(Bac_Man_t *p)

{
  int *__s;
  uint nCap;
  ulong uVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)p->nNtks;
  if (p->nNtks < 1) {
    uVar2 = uVar1;
  }
  iVar4 = 0;
  for (; uVar2 * 0xd0 - uVar1 != 0; uVar1 = uVar1 + 0xd0) {
    iVar4 = iVar4 + *(int *)((long)&p->pNtks[1].vType.nSize + uVar1);
  }
  nCap = iVar4 * 2;
  p_00 = Vec_IntAlloc(nCap);
  p_00->nSize = nCap;
  __s = p_00->pArray;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)(int)nCap << 2);
  }
  lVar5 = 0xd0;
  for (lVar6 = 1; lVar6 <= p->nNtks; lVar6 = lVar6 + 1) {
    Bac_ManAssignInternWordNamesNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar5),p_00);
    lVar5 = lVar5 + 0xd0;
  }
  uVar2 = 0;
  uVar1 = 0;
  if (0 < (int)nCap) {
    uVar1 = (ulong)nCap;
  }
  uVar3 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = uVar3 + (__s[uVar2] == 0);
  }
  if (uVar3 == nCap) {
    Vec_IntFree(p_00);
    return;
  }
  __assert_fail("Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                ,0x18e,"void Bac_ManAssignInternWordNames(Bac_Man_t *)");
}

Assistant:

void Bac_ManAssignInternWordNames( Bac_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( 2*Bac_ManObjNum(p) );
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManAssignInternWordNamesNtk( pNtk, vMap );
    assert( Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
}